

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::objectivec::IsInitName(string *name)

{
  bool bVar1;
  int iVar2;
  allocator<char> local_19;
  string *local_18;
  string *local_10;
  string *name_local;
  
  local_10 = name;
  if (IsInitName(std::__cxx11::string_const&)::init_names_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&IsInitName(std::__cxx11::string_const&)::init_names_abi_cxx11_);
    if (iVar2 != 0) {
      local_18 = IsInitName(std::__cxx11::string_const&)::init_names_abi_cxx11_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)IsInitName(std::__cxx11::string_const&)::init_names_abi_cxx11_,"init",
                 &local_19);
      std::allocator<char>::~allocator(&local_19);
      __cxa_atexit(__cxx_global_array_dtor_12,0,&__dso_handle);
      __cxa_guard_release(&IsInitName(std::__cxx11::string_const&)::init_names_abi_cxx11_);
    }
  }
  bVar1 = anon_unknown_0::IsSpecialName
                    (local_10,IsInitName(std::__cxx11::string_const&)::init_names_abi_cxx11_,1);
  return bVar1;
}

Assistant:

bool IsInitName(const string& name) {
  static const string init_names[] = {"init"};
  return IsSpecialName(name, init_names,
                       sizeof(init_names) / sizeof(init_names[0]));
}